

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase66::run(TestCase66 *this)

{
  Reader reader_00;
  Reader reader_01;
  Reader reader_02;
  undefined1 auVar1 [40];
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  ReaderOptions options;
  AlignedData<1> nullRoot;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  Reader local_168;
  Reader local_138;
  ArrayPtr<const_capnp::word> segments [1];
  SegmentArrayMessageReader reader;
  
  segments[0].ptr = (word *)&nullRoot;
  nullRoot = (AlignedData<1>)0x0;
  segments[0].size_ = 1;
  segments_00.size_ = 1;
  segments_00.ptr = segments;
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  SegmentArrayMessageReader::SegmentArrayMessageReader(&reader,segments_00,options);
  MessageReader::getRoot<capnproto_test::capnp::test::TestDefaults>
            (&local_138,&reader.super_MessageReader);
  reader_00._reader.capTable = local_138._reader.capTable;
  reader_00._reader.segment = local_138._reader.segment;
  reader_00._reader.data = local_138._reader.data;
  reader_00._reader.pointers = local_138._reader.pointers;
  reader_00._reader.dataSize = local_138._reader.dataSize;
  reader_00._reader.pointerCount = local_138._reader.pointerCount;
  reader_00._reader._38_2_ = local_138._reader._38_2_;
  reader_00._reader.nestingLimit = local_138._reader.nestingLimit;
  reader_00._reader._44_4_ = local_138._reader._44_4_;
  checkTestMessage(reader_00);
  readMessageUnchecked<capnproto_test::capnp::test::TestDefaults>(&local_168,nullRoot.words);
  reader_01._reader.capTable = local_168._reader.capTable;
  reader_01._reader.segment = local_168._reader.segment;
  reader_01._reader.data = local_168._reader.data;
  reader_01._reader.pointers = local_168._reader.pointers;
  reader_01._reader.dataSize = local_168._reader.dataSize;
  reader_01._reader.pointerCount = local_168._reader.pointerCount;
  reader_01._reader._38_2_ = local_168._reader._38_2_;
  reader_01._reader.nestingLimit = local_168._reader.nestingLimit;
  reader_01._reader._44_4_ = local_168._reader._44_4_;
  checkTestMessage(reader_01);
  local_178 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_198 = 0;
  uStack_190 = 0;
  uStack_170 = 0x7fffffff;
  auVar1 = ZEXT1640(ZEXT816(0));
  reader_02._reader._40_8_ = 0x7fffffff;
  reader_02._reader.segment = (SegmentReader *)auVar1._0_8_;
  reader_02._reader.capTable = (CapTableReader *)auVar1._8_8_;
  reader_02._reader.data = (void *)auVar1._16_8_;
  reader_02._reader.pointers = (WirePointer *)auVar1._24_8_;
  reader_02._reader.dataSize = auVar1._32_4_;
  reader_02._reader.pointerCount = auVar1._36_2_;
  reader_02._reader._38_2_ = auVar1._38_2_;
  checkTestMessage(reader_02);
  SegmentArrayMessageReader::~SegmentArrayMessageReader(&reader);
  return;
}

Assistant:

TEST(Encoding, Defaults) {
  AlignedData<1> nullRoot = {{0, 0, 0, 0, 0, 0, 0, 0}};
  kj::ArrayPtr<const word> segments[1] = {kj::arrayPtr(nullRoot.words, 1)};
  SegmentArrayMessageReader reader(kj::arrayPtr(segments, 1));

  checkTestMessage(reader.getRoot<TestDefaults>());
  checkTestMessage(readMessageUnchecked<TestDefaults>(nullRoot.words));

  checkTestMessage(TestDefaults::Reader());
}